

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::no_component::no_component(no_component *this,unique_id id)

{
  ostream *this_00;
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream oss;
  ostream local_190 [376];
  unique_id local_18;
  unique_id id_local;
  no_component *this_local;
  
  local_18 = id;
  id_local = (unique_id)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__no_component_00127cd0;
  this->_id = local_18;
  std::__cxx11::string::string((string *)&this->_name);
  std::__cxx11::string::string((string *)&this->_msg);
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"no such component ");
  std::ostream::operator<<(this_00,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

no_component(unique_id id) throw() : exception(), _id(id) {
        std::stringstream oss;
        oss << "no such component " << id;
        _msg = oss.str();
    }